

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_3_4::DeepScanLineOutputFile::DeepScanLineOutputFile
          (DeepScanLineOutputFile *this,char *fileName,Header *header,int numThreads)

{
  int iVar1;
  Data *pDVar2;
  OutputStreamMutex *pOVar3;
  StdOFStream *this_00;
  undefined4 extraout_var;
  uint64_t uVar4;
  stringstream _iex_replace_s;
  
  GenericOutputFile::GenericOutputFile(&this->super_GenericOutputFile);
  (this->super_GenericOutputFile)._vptr_GenericOutputFile =
       (_func_int **)&PTR__DeepScanLineOutputFile_001e3210;
  pDVar2 = (Data *)operator_new(0x180);
  Data::Data(pDVar2,numThreads);
  this->_data = pDVar2;
  pOVar3 = (OutputStreamMutex *)operator_new(0x38);
  (pOVar3->super_mutex).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  pOVar3->os = (OStream *)0x0;
  pOVar3->currentPosition = 0;
  *(undefined8 *)((long)&(pOVar3->super_mutex).super___mutex_base._M_mutex + 0x10) = 0;
  (pOVar3->super_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (pOVar3->super_mutex).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(pOVar3->super_mutex).super___mutex_base._M_mutex + 8) = 0;
  pDVar2->_streamData = pOVar3;
  pDVar2->_deleteStream = true;
  Header::sanityCheck(header,false,false);
  this_00 = (StdOFStream *)operator_new(0x38);
  StdOFStream::StdOFStream(this_00,fileName);
  this->_data->_streamData->os = (OStream *)this_00;
  initialize(this,header);
  iVar1 = (*this->_data->_streamData->os->_vptr_OStream[3])();
  pDVar2 = this->_data;
  pOVar3 = pDVar2->_streamData;
  pOVar3->currentPosition = CONCAT44(extraout_var,iVar1);
  GenericOutputFile::writeMagicNumberAndVersionField
            (&this->super_GenericOutputFile,pOVar3->os,&pDVar2->header);
  uVar4 = Header::writeTo(&this->_data->header,this->_data->_streamData->os,false);
  pDVar2 = this->_data;
  pDVar2->previewPosition = uVar4;
  uVar4 = anon_unknown_7::writeLineOffsets(pDVar2->_streamData->os,&pDVar2->lineOffsets);
  pDVar2 = this->_data;
  pDVar2->lineOffsetsPosition = uVar4;
  pDVar2->multipart = false;
  return;
}

Assistant:

DeepScanLineOutputFile::DeepScanLineOutputFile (
    const char fileName[], const Header& header, int numThreads)
    : _data (new Data (numThreads))
{
    _data->_streamData   = new OutputStreamMutex ();
    _data->_deleteStream = true;
    try
    {
        header.sanityCheck ();
        _data->_streamData->os = new StdOFStream (fileName);
        initialize (header);
        _data->_streamData->currentPosition = _data->_streamData->os->tellp ();

        // Write header and empty offset table to the file.
        writeMagicNumberAndVersionField (
            *_data->_streamData->os, _data->header);
        _data->previewPosition =
            _data->header.writeTo (*_data->_streamData->os);
        _data->lineOffsetsPosition =
            writeLineOffsets (*_data->_streamData->os, _data->lineOffsets);
        _data->multipart = false; // not multipart; only one header
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        delete _data->_streamData->os;
        delete _data->_streamData;
        delete _data;

        REPLACE_EXC (
            e,
            "Cannot open image file "
            "\"" << fileName
                 << "\". " << e.what ());
        throw;
    }
    catch (...)
    {
        delete _data->_streamData->os;
        delete _data->_streamData;
        delete _data;
        throw;
    }
}